

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O1

Twine * llvm::operator+(Twine *__return_storage_ptr__,Twine *LHS,Twine *RHS)

{
  NodeKind NVar1;
  undefined6 uVar2;
  NodeKind NVar3;
  NodeKind RHSKind;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined4 uVar7;
  
  NVar3 = LHS->LHSKind;
  if ((NVar3 == NullKind) || (NVar1 = RHS->LHSKind, NVar1 == NullKind)) {
    __return_storage_ptr__->LHSKind = NullKind;
    __return_storage_ptr__->RHSKind = EmptyKind;
  }
  else {
    if (NVar3 == EmptyKind) {
      NVar3 = RHS->RHSKind;
      uVar2 = *(undefined6 *)&RHS->field_0x12;
      __return_storage_ptr__->LHSKind = RHS->LHSKind;
      __return_storage_ptr__->RHSKind = NVar3;
      *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
      uVar4 = (RHS->LHS).decUI;
      uVar5 = *(undefined4 *)((long)&RHS->LHS + 4);
      uVar6 = (RHS->RHS).decUI;
      uVar7 = *(undefined4 *)((long)&RHS->RHS + 4);
    }
    else {
      if (NVar1 != EmptyKind) {
        if (LHS->RHSKind == EmptyKind) {
          LHS = *(Twine **)&LHS->LHS;
        }
        else {
          NVar3 = TwineKind;
        }
        RHSKind = TwineKind;
        if (RHS->RHSKind == EmptyKind) {
          RHS = *(Twine **)&RHS->LHS;
          RHSKind = NVar1;
        }
        Twine::Twine(__return_storage_ptr__,(Child)LHS,NVar3,(Child)RHS,RHSKind);
        return __return_storage_ptr__;
      }
      NVar3 = LHS->RHSKind;
      uVar2 = *(undefined6 *)&LHS->field_0x12;
      __return_storage_ptr__->LHSKind = LHS->LHSKind;
      __return_storage_ptr__->RHSKind = NVar3;
      *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
      uVar4 = (LHS->LHS).decUI;
      uVar5 = *(undefined4 *)((long)&LHS->LHS + 4);
      uVar6 = (LHS->RHS).decUI;
      uVar7 = *(undefined4 *)((long)&LHS->RHS + 4);
    }
    (__return_storage_ptr__->LHS).decUI = uVar4;
    *(undefined4 *)((long)&__return_storage_ptr__->LHS + 4) = uVar5;
    (__return_storage_ptr__->RHS).decUI = uVar6;
    *(undefined4 *)((long)&__return_storage_ptr__->RHS + 4) = uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Twine operator+(const Twine &LHS, const Twine &RHS) {
    return LHS.concat(RHS);
  }